

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

ListNode * list_free(ListNode *head,CleanupListValue cleanup_value,void *cleanup_value_data)

{
  int iVar1;
  CleanupListValue in_RDX;
  ListNode *in_RSI;
  ListNode *in_RDI;
  
  _assert_true((unsigned_long)cleanup_value_data,(char *)in_RDI,(char *)in_RSI,
               (int)((ulong)in_RDX >> 0x20));
  while( true ) {
    iVar1 = list_empty((ListNode *)0x18f199);
    if (iVar1 != 0) break;
    list_remove_free(in_RSI,in_RDX,(void *)0x18f1be);
  }
  return in_RDI;
}

Assistant:

static ListNode* list_free(
        ListNode * const head, const CleanupListValue cleanup_value,
        void * const cleanup_value_data) {
    assert_non_null(head);
    while (!list_empty(head)) {
        list_remove_free(head->next, cleanup_value, cleanup_value_data);
    }
    return head;
}